

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O0

void __thiscall
agge::tests::mocks::renderer_adapter<unsigned_short>::operator()
          (renderer_adapter<unsigned_short> *this,int x,count_t length,cover_type_conflict1 *covers)

{
  pair<const_unsigned_short_*,_unsigned_int> pVar1;
  value_type local_68 [2];
  allocator<unsigned_short> local_41;
  undefined1 local_40 [8];
  render_log_entry e;
  cover_type_conflict1 *covers_local;
  count_t length_local;
  int x_local;
  renderer_adapter<unsigned_short> *this_local;
  
  local_40._0_4_ = x;
  e.covers.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = covers;
  std::allocator<unsigned_short>::allocator(&local_41);
  std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_short_const*>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&e,covers,covers + length,
             &local_41);
  std::allocator<unsigned_short>::~allocator(&local_41);
  std::
  vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
  ::push_back(&this->render_log,(value_type *)local_40);
  pVar1 = std::make_pair<unsigned_short_const*,unsigned_int>
                    (e.covers.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,length);
  local_68[0].first = pVar1.first;
  local_68[0].second = pVar1.second;
  std::
  vector<std::pair<const_unsigned_short_*,_unsigned_int>,_std::allocator<std::pair<const_unsigned_short_*,_unsigned_int>_>_>
  ::push_back(&this->raw_render_log,local_68);
  render_log_entry::~render_log_entry((render_log_entry *)local_40);
  return;
}

Assistant:

void operator ()(int x, count_t length, const cover_type *covers)
				{
					using namespace std;

					render_log_entry e = { x, vector<cover_type>(covers, covers + length) };
					render_log.push_back(e);
					raw_render_log.push_back(make_pair(covers, length));
				}